

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cc
# Opt level: O0

shared_ptr<spdlog::logger> * lf::assemble::AssembleMatrixLogger(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (AssembleMatrixLogger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&AssembleMatrixLogger()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"lf::assemble::AssembleMatrixLogger",&local_29);
      lf::base::InitLogger((base *)&AssembleMatrixLogger::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::shared_ptr<spdlog::logger>::~shared_ptr,&AssembleMatrixLogger::logger,
                   &__dso_handle);
      __cxa_guard_release(&AssembleMatrixLogger()::logger);
    }
  }
  return &AssembleMatrixLogger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger>& AssembleMatrixLogger() {
  static auto logger = base::InitLogger("lf::assemble::AssembleMatrixLogger");
  return logger;
}